

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

int main(int argc,char **argv)

{
  Benchmark *b;
  char *str;
  bool bVar1;
  int iVar2;
  long lVar3;
  int siz;
  int nthread;
  long lVar4;
  StringPiece local_120;
  RE2 local_110;
  
  lVar3 = 0;
  do {
    if (nbenchmarks <= lVar3) {
      return 0;
    }
    b = benchmarks[lVar3];
    if (argc != 1) {
      str = b->name;
      lVar4 = 1;
      do {
        if (argc <= lVar4) goto LAB_0012e97e;
        re2::StringPiece::StringPiece(&local_120,str);
        re2::RE2::RE2(&local_110,argv[lVar4]);
        bVar1 = re2::RE2::PartialMatch<>(&local_120,&local_110);
        re2::RE2::~RE2(&local_110);
        lVar4 = lVar4 + 1;
      } while (!bVar1);
    }
    for (nthread = b->threadlo; nthread <= b->threadhi; nthread = nthread + 1) {
      siz = b->lo;
      if (siz < 2) {
        siz = 1;
      }
      while( true ) {
        iVar2 = b->hi;
        if (b->hi < 2) {
          iVar2 = 1;
        }
        if (iVar2 < siz) break;
        RunBench(b,nthread,siz);
        siz = siz * 2;
      }
    }
LAB_0012e97e:
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char** argv) {
	for(int i = 0; i < nbenchmarks; i++) {
		Benchmark* b = benchmarks[i];
		if(match(b->name, argc, argv))
			for(int j = b->threadlo; j <= b->threadhi; j++)
				for(int k = max(b->lo, 1); k <= max(b->hi, 1); k<<=1)
					RunBench(b, j, k);
	}
}